

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgstrf.c
# Opt level: O3

void dgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  uint n;
  int iVar1;
  int *et;
  fact_t fVar2;
  int iVar3;
  int_t iVar4;
  int_t iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int_t *piVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int_t *piVar17;
  int nseg;
  ulong local_178;
  int *local_170;
  int *repfnz;
  int *segrep;
  fact_t local_158;
  int nseg1;
  int_t *local_150;
  int_t *xprune;
  superlu_options_t *local_140;
  int *local_138;
  double *dense;
  int *marker;
  uint local_120;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_108;
  int_t *local_100;
  ulong local_f8;
  ulong local_f0;
  int_t *local_e8;
  double *tempv;
  int_t *xplore;
  int_t *local_d0;
  int_t *local_c8;
  int *local_c0;
  int *local_b8;
  SuperMatrix *local_b0;
  ulong local_a8;
  int *local_a0;
  int_t *local_98;
  int_t *local_90;
  double local_88;
  int *panel_lsub;
  int *parent;
  double *dwork;
  int *iwork;
  int_t *local_60;
  long local_58;
  long local_50;
  flops_t *local_48;
  long local_40;
  long local_38;
  
  local_178 = CONCAT44(local_178._4_4_,relax);
  local_170 = etree;
  iVar3 = sp_ienv(6);
  local_158 = options->Fact;
  local_88 = options->DiagPivotThresh;
  local_a0 = stat->panel_histo;
  local_48 = stat->ops;
  uVar6 = A->nrow;
  local_108 = (ulong)uVar6;
  n = A->ncol;
  local_a8 = (ulong)n;
  local_120 = n;
  if ((int)uVar6 < (int)n) {
    local_120 = uVar6;
  }
  piVar17 = (int_t *)A->Store;
  local_38 = *(long *)(piVar17 + 2);
  local_150 = *(int_t **)(piVar17 + 4);
  local_90 = *(int_t **)(piVar17 + 6);
  local_98 = *(int_t **)(piVar17 + 8);
  local_f8 = (ulong)(uint)panel_size;
  local_b0 = A;
  iVar4 = dLUMemInit(local_158,work,lwork,uVar6,n,*piVar17,panel_size,(double)iVar3,L,U,Glu,&iwork,
                     &dwork);
  uVar11 = local_a8;
  uVar14 = local_108;
  *info = iVar4;
  if (iVar4 != 0) {
    return;
  }
  iVar3 = (int)local_178;
  local_b8 = Glu->xsup;
  local_c0 = Glu->supno;
  local_c8 = Glu->xlsub;
  local_d0 = Glu->xlusup;
  local_e8 = Glu->xusub;
  iVar7 = (int)local_a8;
  iVar8 = (int)local_f8;
  iVar12 = (int)local_108;
  local_140 = options;
  SetIWork(iVar12,iVar7,iVar8,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
  dSetRWork(iVar12,iVar8,dwork,&dense,&tempv);
  usepr = (int)(local_158 == SamePattern_SameRowPerm);
  if (local_158 == SamePattern_SameRowPerm) {
    local_138 = int32Malloc(iVar12);
    if (0 < iVar12) {
      uVar13 = 0;
      do {
        local_138[perm_r[uVar13]] = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
  }
  else {
    local_138 = (int *)0x0;
  }
  piVar17 = local_150;
  et = local_170;
  local_170 = int32Malloc(iVar7);
  if (0 < iVar7) {
    uVar13 = 0;
    do {
      local_170[perm_c[uVar13]] = (int)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  piVar9 = intMalloc(iVar7);
  if (local_140->SymmetricMode == YES) {
    heap_relax_snode(iVar7,et,iVar3,marker,piVar9);
  }
  else {
    relax_snode(iVar7,et,iVar3,marker,piVar9);
  }
  ifill(perm_r,iVar12,-1);
  ifill(marker,iVar12 * 3,-1);
  *local_c0 = -1;
  uVar13 = 0;
  *local_d0 = 0;
  *local_e8 = 0;
  *local_c8 = 0;
  *local_b8 = 0;
  local_100 = piVar9;
  if ((int)local_120 < 1) {
    *info = 0;
  }
  else {
    local_60 = piVar9 + 1;
    local_58 = (long)iVar12 * 4;
    local_50 = (long)iVar12 << 3;
    iVar3 = 0;
    do {
      iVar7 = (int)uVar13;
      lVar15 = (long)iVar7;
      iVar12 = local_100[lVar15];
      if (iVar12 == -1) {
        local_178 = uVar13 & 0xffffffff;
        uVar6 = (int)local_f8 + iVar7;
        if ((int)local_120 <= (int)uVar6) {
          uVar6 = local_120;
        }
        uVar14 = 0;
        do {
          if ((long)(int)uVar6 <= (long)(lVar15 + 1 + uVar14)) {
            uVar6 = iVar7 + (int)uVar14 + 1;
            uVar11 = local_f8;
            goto LAB_00105839;
          }
          uVar11 = uVar14 + 1;
          lVar10 = lVar15 + uVar14;
          uVar14 = uVar11;
        } while (local_60[lVar10] == -1);
        uVar6 = iVar7 + (int)uVar11;
LAB_00105839:
        iVar12 = local_120 - iVar7;
        if (uVar6 != local_120) {
          iVar12 = (int)uVar11;
        }
        local_a0[iVar12] = local_a0[iVar12] + 1;
        iVar8 = (int)local_108;
        dpanel_dfs(iVar8,iVar12,iVar7,local_b0,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,xprune,
                   marker,parent,xplore,Glu);
        dpanel_bmod(iVar8,iVar12,iVar7,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar13 = (ulong)(uint)(iVar7 + iVar12);
        piVar17 = local_150;
        if (0 < iVar12) {
          local_140 = (superlu_options_t *)(long)(iVar7 + iVar12);
          lVar16 = 0;
          lVar10 = 0;
          local_f0 = uVar13;
          do {
            nseg = nseg1;
            iVar7 = (int)lVar15;
            iVar12 = dcolumn_dfs((int)local_108,iVar7,perm_r,&nseg,
                                 (int *)((long)panel_lsub + lVar10),segrep,
                                 (int *)((long)repfnz + lVar10),xprune,marker,parent,xplore,Glu);
            *info = iVar12;
            if (iVar12 != 0) {
              return;
            }
            iVar12 = dcolumn_bmod(iVar7,nseg - nseg1,(double *)((long)dense + lVar16),tempv,
                                  segrep + nseg1,(int *)((long)repfnz + lVar10),(int)local_178,Glu,
                                  stat);
            *info = iVar12;
            if (iVar12 != 0) {
              return;
            }
            iVar12 = dcopy_to_ucol(iVar7,nseg,segrep,(int *)((long)repfnz + lVar10),perm_r,
                                   (double *)((long)dense + lVar16),Glu);
            *info = iVar12;
            if (iVar12 != 0) {
              return;
            }
            iVar8 = dpivotL(iVar7,local_88,&usepr,perm_r,local_138,local_170,&pivrow,Glu,stat);
            *info = iVar8;
            iVar12 = iVar3;
            if (iVar3 == 0) {
              iVar12 = iVar8;
            }
            if (iVar8 != 0) {
              iVar3 = iVar12;
            }
            dpruneL(iVar7,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar10),xprune,Glu);
            resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar10));
            lVar15 = lVar15 + 1;
            lVar10 = lVar10 + local_58;
            lVar16 = lVar16 + local_50;
            uVar13 = local_f0;
            piVar17 = local_150;
          } while (lVar15 < (long)local_140);
        }
      }
      else {
        local_a0[(long)(iVar12 - iVar7) + 1] = local_a0[(long)(iVar12 - iVar7) + 1] + 1;
        local_178 = CONCAT44(local_178._4_4_,iVar12);
        iVar4 = dsnode_dfs(iVar7,iVar12,piVar17,local_90,local_98,xprune,marker,Glu);
        *info = iVar4;
        if (iVar4 != 0) {
          return;
        }
        local_140 = (superlu_options_t *)CONCAT44(local_140._4_4_,local_e8[lVar15]);
        iVar4 = local_d0[lVar15];
        local_f0 = (ulong)local_c0[lVar15];
        local_40 = (long)local_b8[local_f0];
        iVar8 = local_c8[local_40 + 1];
        iVar1 = local_c8[local_40];
        nzlumax = Glu->nzlumax;
        while (piVar17 = local_150, nzlumax < (iVar8 - iVar1) * ((iVar12 - iVar7) + 1) + iVar4) {
          iVar5 = dLUMemXpand(iVar7,iVar4,LUSUP,&nzlumax,Glu);
          *info = iVar5;
          if (iVar5 != 0) {
            return;
          }
        }
        if (iVar7 <= (int)local_178) {
          local_178 = CONCAT44(local_178._4_4_,(int)local_178 + 1);
          do {
            local_e8[lVar15 + 1] = (int_t)local_140;
            lVar10 = (long)local_90[lVar15];
            iVar12 = local_98[lVar15];
            if (local_90[lVar15] < iVar12) {
              do {
                dense[piVar17[lVar10]] = *(double *)(local_38 + lVar10 * 8);
                lVar10 = lVar10 + 1;
              } while (iVar12 != lVar10);
            }
            lVar10 = lVar15 + 1;
            dsnode_bmod((int)lVar15,(int)local_f0,(int)local_40,dense,tempv,Glu,stat);
            iVar7 = dpivotL((int)lVar15,local_88,&usepr,perm_r,local_138,local_170,&pivrow,Glu,stat)
            ;
            *info = iVar7;
            iVar12 = iVar3;
            if (iVar3 == 0) {
              iVar12 = iVar7;
            }
            if (iVar7 != 0) {
              iVar3 = iVar12;
            }
            lVar15 = lVar10;
          } while ((int)local_178 != (int)lVar10);
          uVar13 = local_178 & 0xffffffff;
        }
      }
    } while ((int)uVar13 < (int)local_120);
    *info = iVar3;
    iVar7 = iVar3 + -1;
    iVar12 = (int)local_a8;
    uVar14 = local_108;
    uVar11 = local_a8;
    if (iVar3 != 0) goto LAB_00105b73;
  }
  iVar7 = (int)uVar11;
  iVar12 = iVar7;
LAB_00105b73:
  uVar6 = local_120;
  fVar2 = local_158;
  iVar3 = (int)uVar14;
  if (0 < iVar3 && iVar7 < iVar3) {
    uVar11 = 1;
    do {
      if (perm_r[uVar11 - 1] == -1) {
        perm_r[uVar11 - 1] = iVar7;
        iVar7 = iVar7 + 1;
      }
    } while ((uVar11 < uVar14) && (uVar11 = uVar11 + 1, iVar7 < iVar3));
  }
  countnz(local_120,xprune,&nnzL,&nnzU,Glu);
  fixupL(uVar6,perm_r,Glu);
  dLUWorkFree(iwork,dwork,Glu);
  superlu_free(xplore);
  superlu_free(xprune);
  if (fVar2 == SamePattern_SameRowPerm) {
    piVar17 = (int_t *)L->Store;
    *piVar17 = nnzL;
    piVar17[1] = Glu->supno[iVar12];
    piVar9 = Glu->xlusup;
    *(void **)(piVar17 + 2) = Glu->lusup;
    *(int_t **)(piVar17 + 4) = piVar9;
    piVar9 = Glu->xlsub;
    *(int_t **)(piVar17 + 6) = Glu->lsub;
    *(int_t **)(piVar17 + 8) = piVar9;
    piVar17 = (int_t *)U->Store;
    *piVar17 = nnzU;
    piVar9 = Glu->usub;
    *(void **)(piVar17 + 2) = Glu->ucol;
    *(int_t **)(piVar17 + 4) = piVar9;
    *(int_t **)(piVar17 + 6) = Glu->xusub;
  }
  else {
    dCreate_SuperNode_Matrix
              (L,local_b0->nrow,uVar6,nnzL,(double *)Glu->lusup,Glu->xlusup,Glu->lsub,Glu->xlsub,
               Glu->supno,Glu->xsup,SLU_SC,SLU_D,SLU_TRLU);
    dCreate_CompCol_Matrix
              (U,uVar6,uVar6,nnzU,(double *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_D,SLU_TRU);
  }
  piVar17 = local_100;
  local_48[7] = local_48[0x13] + local_48[0x14] + local_48[7];
  iVar3 = Glu->num_expansions + -1;
  Glu->num_expansions = iVar3;
  stat->expansions = iVar3;
  if (fVar2 == SamePattern_SameRowPerm) {
    superlu_free(local_138);
  }
  superlu_free(local_170);
  superlu_free(piVar17);
  return;
}

Assistant:

void
dgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    double    *dwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    double    *dense, *tempv;
    int       *relax_end;
    double    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    double fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = dLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &dwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    dSetRWork(m, panel_size, dwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = dsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = dLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        dsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = dpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		dprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    dpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    dpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = dcolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = dcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = dcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = dpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	dpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		dprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    dLUWorkFree(iwork, dwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (double *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (double *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        dCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (double *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_D, SLU_TRLU);
    	dCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (double *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_D, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}